

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedMessageFieldGenerator::GenerateSerializedSizeCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n  for (int i = 0; i < this.$name$.length; i++) {\n    $type$ element = this.$name$[i];\n    if (element != null) {\n      size += com.google.protobuf.nano.CodedOutputByteBufferNano\n        .compute$group_or_message$Size($number$, element);\n    }\n  }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n"
    "  for (int i = 0; i < this.$name$.length; i++) {\n"
    "    $type$ element = this.$name$[i];\n"
    "    if (element != null) {\n"
    "      size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
    "        .compute$group_or_message$Size($number$, element);\n"
    "    }\n"
    "  }\n"
    "}\n");
}